

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void kj::(anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
               (EncodingResult<kj::Array<char16_t>_> *result,char16_t (*expected) [3],bool errors)

{
  undefined7 in_register_00000011;
  bool in_R8B;
  ArrayPtr<const_char16_t> expected_00;
  Array<char16_t> local_28;
  undefined1 local_10;
  
  expected_00.size_ = CONCAT71(in_register_00000011,errors) & 0xffffffff;
  local_28.ptr = (result->super_Array<char16_t>).ptr;
  local_28.size_ = (result->super_Array<char16_t>).size_;
  local_28.disposer = (result->super_Array<char16_t>).disposer;
  (result->super_Array<char16_t>).ptr = (char16_t *)0x0;
  (result->super_Array<char16_t>).size_ = 0;
  local_10 = result->hadErrors;
  expected_00.ptr = (char16_t *)0x2;
  expectResImpl<kj::Array<char16_t>,char16_t>
            ((_anonymous_namespace_ *)&local_28,(EncodingResult<kj::Array<char16_t>_> *)expected,
             expected_00,in_R8B);
  Array<char16_t>::~Array(&local_28);
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               const U (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr(expected, s - 1), errors);
}